

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6850.cpp
# Opt level: O3

void __thiscall Motorola::ACIA::ACIA::serial_line_did_produce_bit(ACIA *this)

{
  int in_EDX;
  Line<false> *in_RSI;
  
  serial_line_did_produce_bit((ACIA *)&this[-1].interrupt_line_,in_RSI,in_EDX);
  return;
}

Assistant:

bool ACIA::serial_line_did_produce_bit(Serial::Line<false> *, int bit) {
	// Shift this bit into the 11-bit input register; this is big enough to hold
	// the largest transmission symbol.
	++bits_received_;
	bits_incoming_ = (bits_incoming_ >> 1) | (bit << 10);

	// If that's the now-expected number of bits, update.
	const int bit_target = expected_bits();
	if(bits_received_ >= bit_target) {
		bits_received_ = 0;
		overran_ |= get_status() & 1;
		received_data_ = uint8_t(bits_incoming_ >> (12 - bit_target));
		update_interrupt_line();
		update_clocking_observer();
		return false;
	}

	// TODO: overrun, and parity.

	// Keep receiving, and consider a potential clocking change.
	if(bits_received_ == 1) update_clocking_observer();
	return true;
}